

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWFileInfo.h
# Opt level: O1

void __thiscall COLLADAFW::FileInfo::Unit::Unit(Unit *this)

{
  this->_vptr_Unit = (_func_int **)&PTR__Unit_009e2518;
  this->mLinearUnitUnit = METER;
  (this->mLinearUnitName)._M_dataplus._M_p = (pointer)&(this->mLinearUnitName).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mLinearUnitName,LINEAR_UNIT_METER_NAME_abi_cxx11_,
             DAT_00a03340 + LINEAR_UNIT_METER_NAME_abi_cxx11_);
  this->mLinearUnitMeter = 1.0;
  (this->mAngularUnitName)._M_dataplus._M_p = (pointer)&(this->mAngularUnitName).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mAngularUnitName,ANGULAR_UNIT_DEGREES_NAME_abi_cxx11_,
             DAT_00a03420 + ANGULAR_UNIT_DEGREES_NAME_abi_cxx11_);
  this->mAngularUnitUnit = DEGREES;
  (this->mTimeUnitName)._M_dataplus._M_p = (pointer)&(this->mTimeUnitName).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mTimeUnitName,TIME_UNIT_FILM_NAME_abi_cxx11_,
             DAT_00a03460 + TIME_UNIT_FILM_NAME_abi_cxx11_);
  this->mTimeUnitUnit = FILM;
  return;
}

Assistant:

Unit ()
                : mLinearUnitUnit ( METER )
                , mLinearUnitName ( LINEAR_UNIT_METER_NAME )
                , mLinearUnitMeter ( LINEAR_UNIT_METER )
                , mAngularUnitName ( ANGULAR_UNIT_DEGREES_NAME )
                , mAngularUnitUnit ( DEGREES )
                , mTimeUnitName ( TIME_UNIT_FILM_NAME )
                , mTimeUnitUnit ( FILM )
            {}